

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O2

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::twist(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
        *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  for (lVar1 = 0; lVar1 != 0xde; lVar1 = lVar1 + 1) {
    uVar2 = 0x9908b0df;
    if ((this->x[lVar1 + 1] & 1) == 0) {
      uVar2 = 0;
    }
    this->x[lVar1] =
         uVar2 ^ this->x[lVar1 + 0x18d] ^
         (this->x[lVar1 + 1] & 0x7ffffffe | this->x[lVar1] & 0x80000000) >> 1;
  }
  for (lVar1 = -0x14; lVar1 != 0; lVar1 = lVar1 + 4) {
    uVar2 = *(uint *)((long)this->x + lVar1 + 0x390);
    uVar3 = 0x9908b0df;
    if ((uVar2 & 1) == 0) {
      uVar3 = 0;
    }
    *(uint *)((long)this->x + lVar1 + 0x38c) =
         uVar3 ^ *(uint *)((long)&this->i + lVar1) ^
         (uVar2 & 0x7ffffffe | *(uint *)((long)this->x + lVar1 + 0x38c) & 0x80000000) >> 1;
  }
  for (lVar1 = 0xe4; lVar1 != 0x270; lVar1 = lVar1 + 1) {
    uVar2 = 0x9908b0df;
    if ((this->x[lVar1] & 1) == 0) {
      uVar2 = 0;
    }
    this->x[lVar1 + -1] =
         uVar2 ^ *(uint *)((long)this + lVar1 * 4 + -0x390) ^
         (this->x[lVar1] & 0x7ffffffe | this->x[lVar1 + -1] & 0x80000000) >> 1;
  }
  uVar2 = 0x9908b0df;
  if ((this->x[0] & 1) == 0) {
    uVar2 = 0;
  }
  this->x[0x26f] =
       uVar2 ^ this->x[0x18c] ^ (this->x[0] & 0x7ffffffe | this->x[0x26f] & 0x80000000) >> 1;
  this->i = 0;
  return;
}

Assistant:

void
mersenne_twister_engine<UIntType,w,n,m,r,a,u,d,s,b,t,c,l,f>::twist()
{
    const UIntType upper_mask = (~static_cast<UIntType>(0)) << r;
    const UIntType lower_mask = ~upper_mask;

    const std::size_t unroll_factor = 6;
    const std::size_t unroll_extra1 = (n-m) % unroll_factor;
    const std::size_t unroll_extra2 = (m-1) % unroll_factor;

    // split loop to avoid costly modulo operations
    {  // extra scope for MSVC brokenness w.r.t. for scope
        for(std::size_t j = 0; j < n-m-unroll_extra1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m-unroll_extra1; j < n-m; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m; j < n-1-unroll_extra2; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-1-unroll_extra2; j < n-1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    // last iteration
    UIntType y = (x[n-1] & upper_mask) | (x[0] & lower_mask);
    x[n-1] = x[m-1] ^ (y >> 1) ^ ((x[0]&1) * a);
    i = 0;
}